

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_RaiseMaster
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *thing;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  AActor *raiser;
  bool bVar5;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003d9d48;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d9d38:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d9d48:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11f6,
                  "int AF_AActor_A_RaiseMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  raiser = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (raiser == (AActor *)0x0) goto LAB_003d9cdc;
    pPVar3 = (raiser->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(raiser->super_DThinker).super_DObject._vptr_DObject)(raiser);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (raiser->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar5 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar5) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar5) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d9d48;
    }
  }
  else {
    if (raiser != (AActor *)0x0) goto LAB_003d9d38;
LAB_003d9cdc:
    raiser = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_003d9cfc:
      thing = (raiser->master).field_0.p;
      if (thing != (AActor *)0x0) {
        if (((thing->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (param[1].field_0.i == 0) {
            raiser = (AActor *)0x0;
          }
          P_Thing_Raise(thing,raiser);
        }
        else {
          (raiser->master).field_0.p = (AActor *)0x0;
        }
      }
      return 0;
    }
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_003d9cfc;
    pcVar4 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x11f7,
                "int AF_AActor_A_RaiseMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RaiseMaster)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(copy);

	if (self->master != NULL)
	{
		P_Thing_Raise(self->master, copy ? self : NULL);
	}
	return 0;
}